

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

void __thiscall CGL::Application::mouse_released(Application *this,e_mouse_button b)

{
  double dVar1;
  long lVar2;
  long *plVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  double *pdVar6;
  ostream *poVar7;
  int in_ESI;
  long in_RDI;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  Vector2D br;
  Vector2D tl;
  float local_a4;
  Vector2D local_60;
  double local_50;
  double local_48;
  Vector2D local_40;
  double local_30;
  double local_28;
  Vector2D local_20 [2];
  
  if (in_ESI == 0) {
    *(undefined1 *)(in_RDI + 0x380) = 0;
    if ((*(int *)(in_RDI + 0x18) == 1) && ((*(byte *)(*(long *)(in_RDI + 0x28) + 0x28) & 1) != 0)) {
      local_28 = 0.0;
      pdVar6 = std::min<double>((double *)(*(long *)(in_RDI + 0x28) + 8),
                                (double *)(*(long *)(in_RDI + 0x28) + 0x18));
      pdVar6 = std::max<double>(&local_28,pdVar6);
      dVar1 = *pdVar6;
      local_30 = 0.0;
      pdVar6 = std::min<double>((double *)(*(long *)(in_RDI + 0x28) + 0x10),
                                (double *)(*(long *)(in_RDI + 0x28) + 0x20));
      pdVar6 = std::max<double>(&local_30,pdVar6);
      Vector2D::Vector2D(local_20,dVar1,*pdVar6);
      auVar5 = _DAT_002b5bf0;
      auVar4 = _DAT_002b5be0;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = *(ulong *)(in_RDI + 0x2b0);
      auVar8 = vpunpckldq_avx(auVar8,_DAT_002b5be0);
      auVar8 = vsubpd_avx(auVar8,_DAT_002b5bf0);
      auVar9 = vpermilpd_avx(auVar8,1);
      local_48 = auVar9._0_8_ + auVar8._0_8_;
      pdVar6 = std::max<double>((double *)(*(long *)(in_RDI + 0x28) + 8),
                                (double *)(*(long *)(in_RDI + 0x28) + 0x18));
      pdVar6 = std::min<double>(&local_48,pdVar6);
      dVar1 = *pdVar6;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = *(ulong *)(in_RDI + 0x2b8);
      auVar8 = vpunpckldq_avx(auVar9,auVar4);
      auVar8 = vsubpd_avx(auVar8,auVar5);
      auVar9 = vpermilpd_avx(auVar8,1);
      local_50 = (auVar9._0_8_ + auVar8._0_8_) * 1.0;
      pdVar6 = std::max<double>((double *)(*(long *)(in_RDI + 0x28) + 0x10),
                                (double *)(*(long *)(in_RDI + 0x28) + 0x20));
      pdVar6 = std::min<double>(&local_50,pdVar6);
      Vector2D::Vector2D(&local_40,dVar1,*pdVar6);
      lVar2 = *(long *)(in_RDI + 0x28);
      *(double *)(lVar2 + 8) = local_20[0].x;
      *(double *)(lVar2 + 0x10) = local_20[0].y;
      lVar2 = *(long *)(in_RDI + 0x28);
      *(double *)(lVar2 + 0x18) = local_40.x;
      *(double *)(lVar2 + 0x20) = local_40.y;
      poVar7 = std::operator<<((ostream *)&std::cout,"[renderer] Selected cell measures ");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,(int)(local_40.x - local_20[0].x));
      poVar7 = std::operator<<(poVar7,"x");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,(int)(local_40.y - local_20[0].y));
      poVar7 = std::operator<<(poVar7," pixels");
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      (**(code **)(**(long **)(in_RDI + 0x28) + 0x30))();
      (**(code **)(**(long **)(in_RDI + 0x28) + 0x50))();
    }
  }
  else if (in_ESI == 1) {
    if (*(int *)(in_RDI + 0x18) == 1) {
      plVar3 = *(long **)(in_RDI + 0x28);
      local_a4 = (float)*(ulong *)(in_RDI + 0x2b8);
      Vector2D::Vector2D(&local_60,(double)*(float *)(in_RDI + 0x378),
                         (double)(local_a4 - *(float *)(in_RDI + 0x37c)));
      (**(code **)(*plVar3 + 0x40))(plVar3,&local_60);
      (**(code **)(**(long **)(in_RDI + 0x28) + 0x30))();
      (**(code **)(**(long **)(in_RDI + 0x28) + 0x50))();
    }
    *(undefined1 *)(in_RDI + 0x381) = 0;
  }
  else if (in_ESI == 2) {
    *(undefined1 *)(in_RDI + 0x382) = 0;
  }
  return;
}

Assistant:

void Application::mouse_released(e_mouse_button b) {
  switch (b) {
    case LEFT:
      leftDown = false;
      if (mode == RENDER_MODE && renderer->render_cell) {
        Vector2D tl(max(0.,min(renderer->cell_tl.x,renderer->cell_br.x)),
                    max(0.,min(renderer->cell_tl.y,renderer->cell_br.y)));
        Vector2D br(min(screenW*1.,max(renderer->cell_tl.x,renderer->cell_br.x)),
                    min(screenH*1.,max(renderer->cell_tl.y,renderer->cell_br.y)));
        renderer->cell_tl = tl;
        renderer->cell_br = br;
        cout << "[renderer] Selected cell measures " << (int)(br.x-tl.x) << "x" << (int)(br.y-tl.y) << " pixels" << endl;
        renderer->stop();
        renderer->start_raytracing();
      }
      break;
    case RIGHT:
      if (mode == RENDER_MODE) {
        renderer->autofocus(Vector2D(mouseX, screenH - mouseY));
        renderer->stop();
        renderer->start_raytracing();
      }
      rightDown = false;
      break;
    case MIDDLE:
      middleDown = false;
      break;
  }
}